

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-test-part.h
# Opt level: O0

void __thiscall
testing::TestPartResult::TestPartResult
          (TestPartResult *this,Type a_type,char *a_file_name,int a_line_number,char *a_message)

{
  TestPartResult *pTVar1;
  char *message;
  char *local_60;
  allocator local_45 [20];
  allocator local_31;
  TestPartResult *local_30;
  char *a_message_local;
  char *pcStack_20;
  int a_line_number_local;
  char *a_file_name_local;
  TestPartResult *pTStack_10;
  Type a_type_local;
  TestPartResult *this_local;
  
  this->type_ = a_type;
  local_60 = a_file_name;
  if (a_file_name == (char *)0x0) {
    local_60 = anon_var_dwarf_260822 + 9;
  }
  local_30 = (TestPartResult *)a_message;
  a_message_local._4_4_ = a_line_number;
  pcStack_20 = a_file_name;
  a_file_name_local._4_4_ = a_type;
  pTStack_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->file_name_,local_60,&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  this->line_number_ = a_message_local._4_4_;
  ExtractSummary_abi_cxx11_(&this->summary_,local_30,message);
  pTVar1 = local_30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->message_,(char *)pTVar1,local_45);
  std::allocator<char>::~allocator((allocator<char> *)local_45);
  return;
}

Assistant:

TestPartResult(Type a_type, const char* a_file_name, int a_line_number,
                 const char* a_message)
      : type_(a_type),
        file_name_(a_file_name == nullptr ? "" : a_file_name),
        line_number_(a_line_number),
        summary_(ExtractSummary(a_message)),
        message_(a_message) {}